

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderStateQueryTests.cpp
# Opt level: O2

vector<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
* __thiscall
deqp::gles31::Functional::anon_unknown_1::CubeArrayImageTypeCase::getInfos
          (vector<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
           *__return_storage_ptr__,CubeArrayImageTypeCase *this)

{
  long lVar1;
  
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (lVar1 = 0; lVar1 != 0x48; lVar1 = lVar1 + 0x18) {
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
    ::push_back(__return_storage_ptr__,
                (value_type *)((long)&getInfos::samplerTypes[0].glType + lVar1));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<BaseTypeCase::TestTypeInfo> CubeArrayImageTypeCase::getInfos (void) const
{
	static const TestTypeInfo samplerTypes[] =
	{
		{ GL_IMAGE_CUBE_MAP_ARRAY,				"layout(binding=0, rgba8) readonly uniform highp imageCubeArray u_image",	"imageLoad(u_image, ivec3(gl_FragCoord.xyx))"	},
		{ GL_INT_IMAGE_CUBE_MAP_ARRAY,			"layout(binding=0, r32i) readonly uniform highp iimageCubeArray u_image",	"imageLoad(u_image, ivec3(gl_FragCoord.xyx))"	},
		{ GL_UNSIGNED_INT_IMAGE_CUBE_MAP_ARRAY,	"layout(binding=0, r32ui) readonly uniform highp uimageCubeArray u_image",	"imageLoad(u_image, ivec3(gl_FragCoord.xyx))"	},
	};

	std::vector<TestTypeInfo> infos;
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(samplerTypes); ++ndx)
		infos.push_back(samplerTypes[ndx]);

	return infos;
}